

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK4.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::integrators::RK4::oneStepIntegration
          (RK4 *this,double t0,double dT,VectorDynSize *x0,VectorDynSize *x)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  double **ppdVar6;
  MatrixXd *pMVar7;
  element_type *peVar8;
  double dVar9;
  double dVar10;
  undefined8 uVar11;
  Index IVar12;
  int iVar13;
  string *psVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  Index size_1;
  ulong uVar21;
  Index size;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  Index alignedEnd;
  ulong uVar25;
  Index alignedStart;
  bool bVar26;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> buffer_map;
  type tmp;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_110;
  double local_f8;
  ulong local_e0;
  ulong local_d8;
  long local_d0;
  non_const_type local_c8;
  VectorDynSize *local_c0;
  double local_b8;
  VectorDynSize *local_b0;
  RK4 *local_a8;
  long local_a0;
  double local_98;
  double dStack_90;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>_>,_0>
  local_80;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_40;
  
  local_f8 = dT;
  local_b8 = t0;
  if ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    psVar14 = IntegratorInfo::name_abi_cxx11_
                        (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    iDynTree::reportError
              ((psVar14->_M_dataplus)._M_p,"oneStepIntegration","Dynamical system not set.");
  }
  sVar15 = iDynTree::VectorDynSize::size();
  sVar16 = DynamicalSystem::stateSpaceSize
                     ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  if (sVar15 != sVar16) {
    DynamicalSystem::stateSpaceSize
              ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
               super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    iDynTree::VectorDynSize::resize((ulong)x);
  }
  uVar17 = iDynTree::VectorDynSize::data();
  local_b0 = x;
  uVar18 = iDynTree::VectorDynSize::size();
  lVar19 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  uVar20 = iDynTree::VectorDynSize::data();
  local_c0 = &this->m_computationBuffer;
  local_110._8_8_ = iDynTree::VectorDynSize::size();
  pMVar7 = &this->m_K;
  local_c8 = &this->m_aCoefficents;
  local_98 = local_f8;
  dStack_90 = local_f8;
  local_e0 = (ulong)((uint)(uVar17 >> 3) & 1);
  if ((long)uVar18 <= (long)local_e0) {
    local_e0 = uVar18;
  }
  uVar24 = uVar18;
  if ((uVar17 & 7) == 0) {
    uVar24 = local_e0;
  }
  local_d0 = uVar18 - uVar24;
  local_d8 = (local_d0 - (local_d0 >> 0x3f) & 0xfffffffffffffffeU) + uVar24;
  lVar23 = 0;
  uVar25 = 0;
  bVar26 = false;
  local_110._0_8_ = uVar20;
  local_a8 = this;
  while( true ) {
    uVar20 = local_d8;
    local_80.m_rhs.m_matrix.
    super_BlockImpl<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false,_Eigen::Sparse>.m_blockCols.
    m_value = (this->m_aCoefficents).m_outerSize;
    local_80.m_rhs.
    super_TransposeImpl<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>,_Eigen::Sparse>
    .super_SparseTransposeImpl<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>,_0>.
    super_SparseMatrixBase<Eigen::Transpose<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>_>_>
    .m_isRValue = (SparseTransposeImpl<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>,_0>
                   )(SparseMatrixBase<Eigen::Transpose<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>_>_>
                     )0x0;
    local_80.m_rhs.m_matrix.
    super_BlockImpl<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false,_Eigen::Sparse>.
    super_SparseMatrixBase<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false>_>.
    m_isRValue = false;
    local_80.m_rhs.m_matrix.
    super_BlockImpl<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false,_Eigen::Sparse>.m_matrix =
         local_c8;
    local_80.m_rhs.m_matrix.
    super_BlockImpl<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false,_Eigen::Sparse>.m_startCol.
    m_value = 0;
    local_a0 = lVar23;
    local_80.m_lhs = pMVar7;
    local_80.m_rhs.m_matrix.
    super_BlockImpl<Eigen::SparseMatrix<double,_0,_int>,_1,__1,_false,_Eigen::Sparse>.m_startRow.
    m_value = uVar25;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Block<Eigen::SparseMatrix<double,0,int>,1,_1,false>>,0>,Eigen::internal::assign_op<double,double>>
              (&local_110,&local_80,(assign_op<double,_double> *)&local_40,(type)0x0);
    this = local_a8;
    uVar21 = local_110._8_8_;
    if (((local_110._0_8_ & 7) == 0) &&
       (uVar21 = (ulong)((uint)((ulong)local_110._0_8_ >> 3) & 1),
       (long)local_110._8_8_ <= (long)uVar21)) {
      uVar21 = local_110._8_8_;
    }
    if (0 < (long)uVar21) {
      uVar22 = 0;
      do {
        *(double *)(local_110._0_8_ + uVar22 * 8) =
             *(double *)(local_110._0_8_ + uVar22 * 8) * local_f8;
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
    lVar23 = local_110._8_8_ - uVar21;
    uVar22 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + uVar21;
    if (1 < lVar23) {
      do {
        pdVar1 = (double *)(local_110._0_8_ + uVar21 * 8);
        dVar9 = pdVar1[1];
        pdVar2 = (double *)(local_110._0_8_ + uVar21 * 8);
        *pdVar2 = *pdVar1 * local_98;
        pdVar2[1] = dVar9 * dStack_90;
        uVar21 = uVar21 + 2;
      } while ((long)uVar21 < (long)uVar22);
    }
    if ((long)uVar22 < (long)local_110._8_8_) {
      do {
        *(double *)(local_110._0_8_ + uVar22 * 8) =
             *(double *)(local_110._0_8_ + uVar22 * 8) * local_f8;
        uVar22 = uVar22 + 1;
      } while (local_110._8_8_ != uVar22);
    }
    if (0 < (long)uVar24) {
      uVar21 = 0;
      do {
        *(double *)(uVar17 + uVar21 * 8) =
             *(double *)(lVar19 + uVar21 * 8) + *(double *)(local_110._0_8_ + uVar21 * 8);
        uVar21 = uVar21 + 1;
      } while (uVar24 != uVar21);
    }
    uVar21 = uVar24;
    if (1 < local_d0) {
      do {
        pdVar1 = (double *)(lVar19 + uVar21 * 8);
        dVar9 = pdVar1[1];
        pdVar2 = (double *)(local_110._0_8_ + uVar21 * 8);
        dVar10 = pdVar2[1];
        pdVar3 = (double *)(uVar17 + uVar21 * 8);
        *pdVar3 = *pdVar2 + *pdVar1;
        pdVar3[1] = dVar10 + dVar9;
        uVar21 = uVar21 + 2;
      } while ((long)uVar21 < (long)uVar20);
    }
    if ((long)uVar20 < (long)uVar18) {
      do {
        *(double *)(uVar17 + uVar20 * 8) =
             *(double *)(lVar19 + uVar20 * 8) + *(double *)(local_110._0_8_ + uVar20 * 8);
        uVar20 = uVar20 + 1;
      } while (uVar18 != uVar20);
    }
    peVar8 = (local_a8->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
             super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar13 = (*peVar8->_vptr_DynamicalSystem[2])
                       ((local_a8->m_cCoefficients).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data[uVar25] * local_f8 + local_b8,peVar8,local_b0,local_c0);
    if ((char)iVar13 == '\0') break;
    pdVar1 = (this->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    uVar20 = (this->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    uVar21 = uVar20;
    if ((((ulong)(pdVar1 + uVar20 * uVar25) & 7) == 0) &&
       (uVar21 = (ulong)((uint)((ulong)(pdVar1 + uVar20 * uVar25) >> 3) & 1),
       (long)uVar20 <= (long)uVar21)) {
      uVar21 = uVar20;
    }
    if (0 < (long)uVar21) {
      uVar22 = 0;
      do {
        *(undefined8 *)((long)pdVar1 + uVar22 * 8 + uVar20 * local_a0) =
             *(undefined8 *)(local_110._0_8_ + uVar22 * 8);
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
    lVar23 = uVar20 - uVar21;
    uVar22 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + uVar21;
    if (1 < lVar23) {
      do {
        puVar4 = (undefined8 *)(local_110._0_8_ + uVar21 * 8);
        uVar11 = puVar4[1];
        puVar5 = (undefined8 *)((long)pdVar1 + uVar21 * 8 + uVar20 * local_a0);
        *puVar5 = *puVar4;
        puVar5[1] = uVar11;
        uVar21 = uVar21 + 2;
      } while ((long)uVar21 < (long)uVar22);
    }
    if ((long)uVar22 < (long)uVar20) {
      do {
        *(undefined8 *)((long)pdVar1 + uVar22 * 8 + uVar20 * local_a0) =
             *(undefined8 *)(local_110._0_8_ + uVar22 * 8);
        uVar22 = uVar22 + 1;
      } while (uVar20 != uVar22);
    }
    bVar26 = 2 < uVar25;
    uVar25 = uVar25 + 1;
    lVar23 = local_a0 + 8;
    if (uVar25 == 4) {
      local_40.m_rhs = &this->m_bCoefficients;
      local_40.m_lhs = pMVar7;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_80,&local_40);
      uVar20 = local_110._8_8_;
      if (((local_110._0_8_ & 7) == 0) &&
         (uVar20 = (ulong)((uint)((ulong)local_110._0_8_ >> 3) & 1),
         (long)local_110._8_8_ <= (long)uVar20)) {
        uVar20 = local_110._8_8_;
      }
      lVar23 = local_110._8_8_ - uVar20;
      if (0 < (long)uVar20) {
        uVar24 = 0;
        do {
          *(double **)(local_110._0_8_ + uVar24 * 8) =
               (&((local_80.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 ).m_storage.m_data)[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar20 != uVar24);
      }
      uVar24 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + uVar20;
      if (1 < lVar23) {
        do {
          ppdVar6 = &((local_80.m_lhs)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_data + uVar20;
          IVar12 = (Index)ppdVar6[1];
          puVar4 = (undefined8 *)(local_110._0_8_ + uVar20 * 8);
          *puVar4 = *ppdVar6;
          puVar4[1] = IVar12;
          uVar20 = uVar20 + 2;
        } while ((long)uVar20 < (long)uVar24);
      }
      if ((long)uVar24 < (long)local_110._8_8_) {
        do {
          *(double **)(local_110._0_8_ + uVar24 * 8) =
               (&((local_80.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 ).m_storage.m_data)[uVar24];
          uVar24 = uVar24 + 1;
        } while (local_110._8_8_ != uVar24);
      }
      free(local_80.m_lhs);
      if ((uVar17 & 7) != 0) {
        local_e0 = uVar18;
      }
      lVar23 = uVar18 - local_e0;
      if (0 < (long)local_e0) {
        uVar20 = 0;
        do {
          *(double *)(uVar17 + uVar20 * 8) =
               *(double *)(local_110._0_8_ + uVar20 * 8) * local_f8 +
               *(double *)(lVar19 + uVar20 * 8);
          uVar20 = uVar20 + 1;
        } while (local_e0 != uVar20);
      }
      uVar20 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + local_e0;
      if (1 < lVar23) {
        do {
          pdVar1 = (double *)(lVar19 + local_e0 * 8);
          dVar9 = pdVar1[1];
          pdVar2 = (double *)(local_110._0_8_ + local_e0 * 8);
          dVar10 = pdVar2[1];
          pdVar3 = (double *)(uVar17 + local_e0 * 8);
          *pdVar3 = *pdVar2 * local_98 + *pdVar1;
          pdVar3[1] = dVar10 * dStack_90 + dVar9;
          local_e0 = local_e0 + 2;
        } while ((long)local_e0 < (long)uVar20);
      }
      if ((long)uVar20 < (long)uVar18) {
        do {
          *(double *)(uVar17 + uVar20 * 8) =
               *(double *)(local_110._0_8_ + uVar20 * 8) * local_f8 +
               *(double *)(lVar19 + uVar20 * 8);
          uVar20 = uVar20 + 1;
        } while (uVar18 != uVar20);
      }
      return true;
    }
  }
  return bVar26;
}

Assistant:

bool RK4::oneStepIntegration(double t0, double dT, const VectorDynSize &x0, VectorDynSize &x){
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "oneStepIntegration", "Dynamical system not set.");
                }

                if (x.size() != m_dynamicalSystem_ptr->stateSpaceSize()) {
                    x.resize(m_dynamicalSystem_ptr->stateSpaceSize());
                }

                Eigen::Map<Eigen::VectorXd> x_map(x.data(), x.size());
                const Eigen::Map<const Eigen::VectorXd> x0_map(x0.data(), x0.size());
                Eigen::Map<Eigen::VectorXd> buffer_map(m_computationBuffer.data(), m_computationBuffer.size());
                bool ok;
                for (int i=0; i<4; ++i){
                    buffer_map = m_K * m_aCoefficents.row(i).transpose(); //use the x vector as buffer
                    buffer_map = dT*buffer_map;   //use the x vector as buffer
                    x_map = x0_map + buffer_map;
                    ok = m_dynamicalSystem_ptr->dynamics(x, t0 + m_cCoefficients(i)*dT, m_computationBuffer);
                    if(!ok){
                        return false;
                    }
                    m_K.col(i) = buffer_map;
                }

                buffer_map = m_K * m_bCoefficients;
                x_map = x0_map + dT * buffer_map;
                return true;
            }